

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Aig_Obj_t *
createAndGateForMonotonicityVerification
          (Aig_Man_t *pNewAig,Vec_Ptr_t *vDisjunctionSignals,Vec_Ptr_t *vDisjunctionLo,
          Aig_Obj_t *pendingLo,Aig_Obj_t *pendingSignal)

{
  Aig_Obj_t *p0;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p0_00;
  long lVar3;
  
  p0_00 = pNewAig->pConst1;
  p0 = Aig_And(pNewAig,pendingLo,pendingSignal);
  if (0 < vDisjunctionSignals->nSize) {
    lVar3 = 0;
    do {
      if (vDisjunctionLo->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar2 = (Aig_Obj_t *)vDisjunctionSignals->pArray[lVar3];
      pAVar1 = Aig_And(pNewAig,p0,(Aig_Obj_t *)vDisjunctionLo->pArray[lVar3]);
      pAVar2 = Aig_Or(pNewAig,(Aig_Obj_t *)((ulong)pAVar1 ^ 1),pAVar2);
      p0_00 = Aig_And(pNewAig,p0_00,pAVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vDisjunctionSignals->nSize);
  }
  return p0_00;
}

Assistant:

Aig_Obj_t *createAndGateForMonotonicityVerification(
				Aig_Man_t *pNewAig,
				Vec_Ptr_t *vDisjunctionSignals,
				Vec_Ptr_t *vDisjunctionLo,
				Aig_Obj_t *pendingLo,
				Aig_Obj_t *pendingSignal
				)
{
	Aig_Obj_t *pObjBigAnd, *pObj, *pObjLo, *pObjImply;
	Aig_Obj_t *pObjPendingAndPendingLo;
	int i;

	pObjBigAnd = Aig_ManConst1( pNewAig );
	pObjPendingAndPendingLo = Aig_And( pNewAig, pendingLo, pendingSignal );
	Vec_PtrForEachEntry( Aig_Obj_t *, vDisjunctionSignals, pObj, i )
	{
		pObjLo = (Aig_Obj_t *)Vec_PtrEntry( vDisjunctionLo, i );	
		pObjImply = Aig_Or( pNewAig, Aig_Not(Aig_And( pNewAig, pObjPendingAndPendingLo, pObjLo)),
					pObj );
		pObjBigAnd = Aig_And( pNewAig, pObjBigAnd, pObjImply );
	}
	return pObjBigAnd;
}